

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::anon_unknown_26::TapAssertionPrinter::print(TapAssertionPrinter *this)

{
  StringRef passOrFail;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef passOrFail_05;
  bool bVar1;
  OfType OVar2;
  StringRef SVar3;
  StringRef local_58;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  MessageInfo *local_18;
  TapAssertionPrinter *local_10;
  TapAssertionPrinter *this_local;
  
  local_10 = this;
  local_18 = (MessageInfo *)
             std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                       (this->messages);
  (this->itMessage)._M_current = local_18;
  OVar2 = AssertionResult::getResultType(this->result);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      local_28 = "ok";
      local_20 = 2;
      SVar3.m_size = 2;
      SVar3.m_start = "ok";
      printResultType(this,SVar3);
      printOriginalExpression(this);
      printReconstructedExpression(this);
      bVar1 = AssertionResult::hasExpression(this->result);
      if (!bVar1) {
        printRemainingMessages(this,None);
        return;
      }
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 == Info) {
      SVar3 = operator____sr("info",4);
      printResultType(this,SVar3);
      printMessage(this);
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 == Warning) {
      SVar3 = operator____sr("warning",7);
      printResultType(this,SVar3);
      printMessage(this);
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 == ExplicitSkip) {
      passOrFail.m_size = 2;
      passOrFail.m_start = "ok";
      printResultType(this,passOrFail);
      SVar3 = operator____sr(" # SKIP",7);
      printIssue(this,SVar3);
      printMessage(this);
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(this->result);
        if (bVar1) {
          local_38 = "ok";
          local_30 = 2;
          passOrFail_05.m_size = 2;
          passOrFail_05.m_start = "ok";
          printResultType(this,passOrFail_05);
        }
        else {
          local_48 = "not ok";
          local_40 = 6;
          passOrFail_04.m_size = 6;
          passOrFail_04.m_start = "not ok";
          printResultType(this,passOrFail_04);
        }
        printOriginalExpression(this);
        printReconstructedExpression(this);
        bVar1 = AssertionResult::isOk(this->result);
        if (bVar1) {
          StringRef::StringRef(&local_58," # TODO");
          printIssue(this,local_58);
        }
        printRemainingMessages(this,FileName);
        return;
      }
      if (OVar2 == ExplicitFailure) {
        passOrFail_00.m_size = 6;
        passOrFail_00.m_start = "not ok";
        printResultType(this,passOrFail_00);
        SVar3 = operator____sr("explicitly",10);
        printIssue(this,SVar3);
        printRemainingMessages(this,None);
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          passOrFail_03.m_size = 6;
          passOrFail_03.m_start = "not ok";
          printResultType(this,passOrFail_03);
          SVar3 = operator____sr("unexpected exception with message:",0x22);
          printIssue(this,SVar3);
          printMessage(this);
          printExpressionWas(this);
          printRemainingMessages(this,FileName);
          return;
        }
        if (OVar2 != DidntThrowException) {
          if (OVar2 != FatalErrorCondition) {
            return;
          }
          passOrFail_02.m_size = 6;
          passOrFail_02.m_start = "not ok";
          printResultType(this,passOrFail_02);
          SVar3 = operator____sr("fatal error condition with message:",0x23);
          printIssue(this,SVar3);
          printMessage(this);
          printExpressionWas(this);
          printRemainingMessages(this,FileName);
          return;
        }
        passOrFail_01.m_size = 6;
        passOrFail_01.m_start = "not ok";
        printResultType(this,passOrFail_01);
        SVar3 = operator____sr("expected exception, got none",0x1c);
        printIssue(this,SVar3);
        printExpressionWas(this);
        printRemainingMessages(this,FileName);
        return;
      }
    }
  }
  SVar3 = operator____sr("** internal error **",0x14);
  printResultType(this,SVar3);
  return;
}

Assistant:

void print() {
                itMessage = messages.begin();

                switch (result.getResultType()) {
                case ResultWas::Ok:
                    printResultType(tapPassedString);
                    printOriginalExpression();
                    printReconstructedExpression();
                    if (!result.hasExpression())
                        printRemainingMessages(Colour::None);
                    else
                        printRemainingMessages();
                    break;
                case ResultWas::ExpressionFailed:
                    if (result.isOk()) {
                        printResultType(tapPassedString);
                    } else {
                        printResultType(tapFailedString);
                    }
                    printOriginalExpression();
                    printReconstructedExpression();
                    if (result.isOk()) {
                        printIssue(" # TODO");
                    }
                    printRemainingMessages();
                    break;
                case ResultWas::ThrewException:
                    printResultType(tapFailedString);
                    printIssue("unexpected exception with message:"_sr);
                    printMessage();
                    printExpressionWas();
                    printRemainingMessages();
                    break;
                case ResultWas::FatalErrorCondition:
                    printResultType(tapFailedString);
                    printIssue("fatal error condition with message:"_sr);
                    printMessage();
                    printExpressionWas();
                    printRemainingMessages();
                    break;
                case ResultWas::DidntThrowException:
                    printResultType(tapFailedString);
                    printIssue("expected exception, got none"_sr);
                    printExpressionWas();
                    printRemainingMessages();
                    break;
                case ResultWas::Info:
                    printResultType("info"_sr);
                    printMessage();
                    printRemainingMessages();
                    break;
                case ResultWas::Warning:
                    printResultType("warning"_sr);
                    printMessage();
                    printRemainingMessages();
                    break;
                case ResultWas::ExplicitFailure:
                    printResultType(tapFailedString);
                    printIssue("explicitly"_sr);
                    printRemainingMessages(Colour::None);
                    break;
                case ResultWas::ExplicitSkip:
                    printResultType(tapPassedString);
                    printIssue(" # SKIP"_sr);
                    printMessage();
                    printRemainingMessages();
                    break;
                    // These cases are here to prevent compiler warnings
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    printResultType("** internal error **"_sr);
                    break;
                }
            }